

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O1

ProValueMap * __thiscall
QMakeEvaluator::findValues(QMakeEvaluator *this,ProKey *variableName,Iterator *rit)

{
  bool bVar1;
  ulong uVar2;
  iterator iVar3;
  ulong uVar4;
  char16_t *pcVar5;
  _List_node_base *unaff_RBX;
  ulong uVar6;
  _List_node_base *this_00;
  _List_node_base *p_Var7;
  bool bVar8;
  
  bVar8 = true;
  p_Var7 = (_List_node_base *)&this->m_valuemapStack;
  do {
    p_Var7 = p_Var7->_M_prev;
    this_00 = p_Var7 + 1;
    iVar3 = QMap<ProKey,_ProStringList>::find((QMap<ProKey,_ProStringList> *)this_00,variableName);
    QMap<ProKey,_ProStringList>::detach((QMap<ProKey,_ProStringList> *)this_00);
    if (iVar3.i._M_node == (_Base_ptr)(p_Var7[1]._M_next + 1)) {
      if (p_Var7 == (this->m_valuemapStack).
                    super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                    .
                    super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next) goto LAB_00283263;
      if (bVar8) {
        pcVar5 = (variableName->super_ProString).m_string.d.ptr;
        if (pcVar5 == (char16_t *)0x0) {
          pcVar5 = (char16_t *)&QString::_empty;
        }
        uVar4 = (ulong)(variableName->super_ProString).m_length;
        bVar8 = (long)uVar4 < 1;
        if (0 < (long)uVar4) {
          if (9 < (ushort)(pcVar5[(variableName->super_ProString).m_offset] + L'￐'))
          goto LAB_0028326a;
          uVar2 = 1;
          do {
            uVar6 = uVar2;
            if (uVar4 == uVar6) break;
            uVar2 = uVar6 + 1;
          } while ((ushort)((pcVar5 + (variableName->super_ProString).m_offset)[uVar6] + L'￐') <
                   10);
          bVar8 = uVar4 <= uVar6;
        }
        if (bVar8) goto LAB_00283263;
      }
LAB_0028326a:
      bVar1 = true;
      this_00 = unaff_RBX;
    }
    else if (*(long *)((long)iVar3.i._M_node + 0x58) == QMakeInternal::statics._608_8_) {
LAB_00283263:
      bVar1 = false;
      this_00 = (_List_node_base *)0x0;
    }
    else {
      (rit->i)._M_node = (_Base_ptr)iVar3.i._M_node;
      bVar1 = false;
      unaff_RBX = this_00;
    }
    bVar8 = false;
    if (!bVar1) {
      return (ProValueMap *)this_00;
    }
  } while( true );
}

Assistant:

ProValueMap *QMakeEvaluator::findValues(const ProKey &variableName, ProValueMap::Iterator *rit)
{
    ProValueMapStack::iterator vmi = m_valuemapStack.end();
    for (bool first = true; ; first = false) {
        --vmi;
        ProValueMap::Iterator it = (*vmi).find(variableName);
        if (it != (*vmi).end()) {
            if (it->constBegin() == statics.fakeValue.constBegin())
                break;
            *rit = it;
            return &(*vmi);
        }
        if (vmi == m_valuemapStack.begin())
            break;
        if (first && isFunctParam(variableName))
            break;
    }
    return nullptr;
}